

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswIslands.c
# Opt level: O0

void Ssw_MatchingComplete(Aig_Man_t *p0,Aig_Man_t *p1)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *p;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  int local_3c;
  int i;
  Aig_Obj_t *pObj1;
  Aig_Obj_t *pObj0Li;
  Aig_Obj_t *pObj0;
  Vec_Ptr_t *vNewLis;
  Aig_Man_t *p1_local;
  Aig_Man_t *p0_local;
  
  p = Vec_PtrAlloc(100);
  for (local_3c = 0; iVar1 = Saig_ManRegNum(p0), local_3c < iVar1; local_3c = local_3c + 1) {
    pAVar3 = Saig_ManLi(p0,local_3c);
    pAVar4 = Saig_ManLo(p0,local_3c);
    if ((pAVar4->field_5).pData == (void *)0x0) {
      pAVar5 = Aig_ObjCreateCi(p1);
      (pAVar4->field_5).pData = pAVar5;
      (pAVar5->field_5).pData = pAVar4;
      Vec_PtrPush(p,pAVar3);
    }
  }
  for (local_3c = 0; iVar1 = Vec_PtrSize(p0->vObjs), local_3c < iVar1; local_3c = local_3c + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p0->vObjs,local_3c);
    if (((pAVar3 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar3), iVar1 != 0)) &&
       ((pAVar3->field_5).pData == (void *)0x0)) {
      pAVar4 = Aig_ObjChild0Copy(pAVar3);
      pAVar5 = Aig_ObjChild1Copy(pAVar3);
      pAVar4 = Aig_And(p1,pAVar4,pAVar5);
      (pAVar3->field_5).pData = pAVar4;
      (pAVar4->field_5).pData = pAVar3;
    }
  }
  for (local_3c = 0; iVar1 = Vec_PtrSize(p), local_3c < iVar1; local_3c = local_3c + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p,local_3c);
    pAVar3 = Aig_ObjChild0Copy(pAVar3);
    Aig_ObjCreateCo(p1,pAVar3);
  }
  iVar1 = Aig_ManRegNum(p1);
  iVar2 = Vec_PtrSize(p);
  Aig_ManSetRegNum(p1,iVar1 + iVar2);
  Vec_PtrFree(p);
  return;
}

Assistant:

void Ssw_MatchingComplete( Aig_Man_t * p0, Aig_Man_t * p1 )
{
    Vec_Ptr_t * vNewLis;
    Aig_Obj_t * pObj0, * pObj0Li, * pObj1;
    int i;
    // create register outputs in p0 that are absent in p1
    vNewLis = Vec_PtrAlloc( 100 );
    Saig_ManForEachLiLo( p0, pObj0Li, pObj0, i )
    {
        if ( pObj0->pData != NULL )
            continue;
        pObj1 = Aig_ObjCreateCi( p1 );
        pObj0->pData = pObj1;
        pObj1->pData = pObj0;
        Vec_PtrPush( vNewLis, pObj0Li );
    }
    // add missing nodes in the topological order
    Aig_ManForEachNode( p0, pObj0, i )
    {
        if ( pObj0->pData != NULL )
            continue;
        pObj1 = Aig_And( p1, Aig_ObjChild0Copy(pObj0), Aig_ObjChild1Copy(pObj0) );
        pObj0->pData = pObj1;
        pObj1->pData = pObj0;
    }
    // create register outputs in p0 that are absent in p1
    Vec_PtrForEachEntry( Aig_Obj_t *, vNewLis, pObj0Li, i )
        Aig_ObjCreateCo( p1, Aig_ObjChild0Copy(pObj0Li) );
    // increment the number of registers
    Aig_ManSetRegNum( p1, Aig_ManRegNum(p1) + Vec_PtrSize(vNewLis) );
    Vec_PtrFree( vNewLis );
}